

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_int.c
# Opt level: O0

arg_int * arg_int0(char *shortopts,char *longopts,char *datatype,char *glossary)

{
  arg_int *paVar1;
  char *glossary_local;
  char *datatype_local;
  char *longopts_local;
  char *shortopts_local;
  
  paVar1 = arg_intn(shortopts,longopts,datatype,0,1,glossary);
  return paVar1;
}

Assistant:

struct arg_int* arg_int0(const char* shortopts, const char* longopts, const char* datatype, const char* glossary) {
    return arg_intn(shortopts, longopts, datatype, 0, 1, glossary);
}